

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-mqtt.c
# Opt level: O2

int rops_handle_POLLOUT_mqtt(lws *wsi)

{
  lws **pplVar1;
  undefined1 *puVar2;
  _lws_mqtt_related *p_Var3;
  int iVar4;
  lws *wsi_00;
  lws *plVar5;
  lws **wsi2;
  lws **pplVar6;
  lws **pplVar7;
  bool bVar8;
  uint8_t buf [18];
  uint8_t local_36 [6];
  
  _lws_log(0x10,"%s\n","rops_handle_POLLOUT_mqtt");
  p_Var3 = wsi->mqtt;
  if ((p_Var3 == (_lws_mqtt_related *)0x0) || ((p_Var3->field_0xfe & 5) != 1)) {
    wsi_00 = lws_get_network_wsi(wsi);
    (wsi_00->mux).requested_POLLOUT = '\0';
    if ((wsi_00->mux).child_list == (lws *)0x0) {
      _lws_log(0x10,"%s: no children\n","rops_handle_POLLOUT_mqtt");
      return 3;
    }
    pplVar7 = &(wsi_00->mux).child_list;
    lws_wsi_mux_dump_waiting_children(wsi_00);
    wsi2 = pplVar7;
    do {
      plVar5 = *wsi2;
      pplVar1 = &(plVar5->mux).sibling_list;
      pplVar6 = pplVar1;
      if (((((plVar5->mux).requested_POLLOUT != '\0') && ((wsi_00->wsistate & 0x100) != 0)) &&
          (((wsi_00->mqtt->field_0xfe & 4) == 0 || ((plVar5->mqtt->field_0xfe & 4) != 0)))) &&
         (plVar5 = lws_wsi_mux_move_child_to_tail(wsi2), pplVar6 = pplVar7, plVar5 != (lws *)0x0)) {
        _lws_log(0x10,"%s: child %p (wsistate 0x%x)\n","rops_handle_POLLOUT_mqtt",plVar5,
                 (ulong)plVar5->wsistate);
        if (((short)wsi_00->wsistate == 0x119) && ((wsi_00->mqtt->field_0xfe & 0x24) == 0x20)) {
          _lws_log(4,"%s: issuing PUBACK for pkt id: %d\n","rops_handle_POLLOUT_mqtt",
                   (ulong)wsi_00->mqtt->ack_pkt_id);
          buf[0x10] = '@';
          buf[0x11] = '\x02';
          lws_ser_wu16be(local_36,wsi_00->mqtt->ack_pkt_id);
          iVar4 = lws_write(wsi_00,buf + 0x10,4,LWS_WRITE_BINARY);
          if (iVar4 != 4) {
            return 1;
          }
          puVar2 = &wsi_00->mqtt->field_0xfe;
          *puVar2 = *puVar2 & 0xdf;
          (plVar5->mux).requested_POLLOUT = '\x01';
        }
        else {
          iVar4 = lws_callback_as_writeable(plVar5);
          pplVar6 = pplVar1;
          if (iVar4 != 0) {
            _lws_log(4,"%s: Closing child %p\n","rops_handle_POLLOUT_mqtt",plVar5);
            lws_close_free_wsi(plVar5,LWS_CLOSE_STATUS_NOSTATUS,"mqtt pollout handle");
            pplVar6 = pplVar7;
          }
        }
      }
    } while ((*pplVar6 != (lws *)0x0) &&
            (iVar4 = lws_send_pipe_choked(wsi_00), wsi2 = pplVar6, iVar4 == 0));
    iVar4 = lws_wsi_mux_action_pending_writeable_reqs(wsi_00);
    bVar8 = iVar4 == 0;
  }
  else {
    p_Var3->field_0xfe = p_Var3->field_0xfe & 0xfa;
    _lws_log(4,"%s: issuing PINGREQ\n","rops_handle_POLLOUT_mqtt");
    buf[0x10] = 0xc0;
    buf[0x11] = '\0';
    iVar4 = lws_write(wsi,buf + 0x10,2,LWS_WRITE_BINARY);
    bVar8 = iVar4 == 2;
  }
  return (uint)!bVar8;
}

Assistant:

static int
rops_handle_POLLOUT_mqtt(struct lws *wsi)
{
	struct lws **wsi2;

	lwsl_debug("%s\n", __func__);

#if defined(LWS_WITH_CLIENT)
	if (wsi->mqtt && wsi->mqtt->send_pingreq && !wsi->mqtt->inside_payload) {
		uint8_t buf[LWS_PRE + 2];

		/*
		 * We are swallowing this POLLOUT in order to send a PINGREQ
		 * autonomously
		 */

		wsi->mqtt->send_pingreq = 0;

		lwsl_notice("%s: issuing PINGREQ\n", __func__);

		buf[LWS_PRE] = LMQCP_CTOS_PINGREQ << 4;
		buf[LWS_PRE + 1] = 0;

		if (lws_write(wsi, (uint8_t *)&buf[LWS_PRE], 2,
			      LWS_WRITE_BINARY) != 2)
			return LWS_HP_RET_BAIL_DIE;

		return LWS_HP_RET_BAIL_OK;
	}
#endif

	wsi = lws_get_network_wsi(wsi);

	wsi->mux.requested_POLLOUT = 0;

	wsi2 = &wsi->mux.child_list;
	if (!*wsi2) {
		lwsl_debug("%s: no children\n", __func__);
		return LWS_HP_RET_DROP_POLLOUT;
	}

	lws_wsi_mux_dump_waiting_children(wsi);

	do {
		struct lws *w, **wa;

		wa = &(*wsi2)->mux.sibling_list;
		if (!(*wsi2)->mux.requested_POLLOUT)
			goto next_child;

		if (!lwsi_state_can_handle_POLLOUT(wsi))
			goto next_child;

		/*
		 * If the nwsi is in the middle of a frame, we can only
		 * continue to send that
		 */

		if (wsi->mqtt->inside_payload && !(*wsi2)->mqtt->inside_payload)
			goto next_child;

		/*
		 * we're going to do writable callback for this child.
		 * move him to be the last child
		 */
		w = lws_wsi_mux_move_child_to_tail(wsi2);
		if (!w) {
			wa = &wsi->mux.child_list;
			goto next_child;
		}

		lwsl_debug("%s: child %p (wsistate 0x%x)\n", __func__, w,
			    (unsigned int)w->wsistate);

		if (lwsi_state(wsi) == LRS_ESTABLISHED &&
		    !wsi->mqtt->inside_payload &&
		    wsi->mqtt->send_puback) {
			uint8_t buf[LWS_PRE + 4];
			lwsl_notice("%s: issuing PUBACK for pkt id: %d\n",
				    __func__, wsi->mqtt->ack_pkt_id);

			/* Fixed header */
			buf[LWS_PRE] = LMQCP_PUBACK << 4;
			/* Remaining len = 2 */
			buf[LWS_PRE + 1] = 2;
			/* Packet ID */
			lws_ser_wu16be(&buf[LWS_PRE + 2], wsi->mqtt->ack_pkt_id);

			if (lws_write(wsi, (uint8_t *)&buf[LWS_PRE], 4,
				      LWS_WRITE_BINARY) != 4)
				return LWS_HP_RET_BAIL_DIE;

			wsi->mqtt->send_puback = 0;
			w->mux.requested_POLLOUT = 1;

			wa = &wsi->mux.child_list;
			goto next_child;
		}

		if (lws_callback_as_writeable(w)) {
			lwsl_notice("%s: Closing child %p\n", __func__, w);
			lws_close_free_wsi(w, LWS_CLOSE_STATUS_NOSTATUS,
					   "mqtt pollout handle");
			wa = &wsi->mux.child_list;
		}

next_child:
		wsi2 = wa;
	} while (wsi2 && *wsi2 && !lws_send_pipe_choked(wsi));

	// lws_wsi_mux_dump_waiting_children(wsi);

	if (lws_wsi_mux_action_pending_writeable_reqs(wsi))
		return LWS_HP_RET_BAIL_DIE;

	return LWS_HP_RET_BAIL_OK;
}